

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O3

bool __thiscall jrtplib::RTPUDPv6Transmitter::SupportsMulticasting(RTPUDPv6Transmitter *this)

{
  if (this->init == true) {
    return (bool)(this->supportsmulticasting & this->created);
  }
  return false;
}

Assistant:

bool RTPUDPv6Transmitter::SupportsMulticasting()
{
	if (!init)
		return false;
	
	MAINMUTEX_LOCK
	
	bool v;
		
	if (!created)
		v = false;
	else
		v = supportsmulticasting;

	MAINMUTEX_UNLOCK
	return v;
}